

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astc_codec.cpp
# Opt level: O0

astcenc_profile astcEncoderProfile(ktxAstcParams *params,uint32_t *bdb)

{
  uint uVar1;
  astcenc_profile aVar2;
  long in_RSI;
  bool ldr;
  bool sRGB;
  ktx_uint32_t transfer;
  
  uVar1 = *(uint *)(in_RSI + 8) >> 0x10 & 0xff;
  if ((uVar1 != 2) && (uVar1 != 1)) {
    __assert_fail("transfer == KHR_DF_TRANSFER_LINEAR && \"Unsupported transfer function, only support sRGB and Linear\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/astc_codec.cpp"
                  ,0x181,
                  "astcenc_profile astcEncoderProfile(const ktxAstcParams &, const uint32_t *)");
  }
  aVar2 = astcProfile(false,true);
  return aVar2;
}

Assistant:

static astcenc_profile
astcEncoderProfile(const ktxAstcParams &params, const uint32_t* bdb) {

    ktx_uint32_t transfer = KHR_DFDVAL(bdb, TRANSFER);

    bool sRGB = transfer == KHR_DF_TRANSFER_SRGB;
    bool ldr = params.mode == KTX_PACK_ASTC_ENCODER_MODE_LDR;

    if (!sRGB) {
        assert(transfer == KHR_DF_TRANSFER_LINEAR && "Unsupported transfer function, only support sRGB and Linear");
    }

    return astcProfile(sRGB, ldr);
}